

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDFObjectHandle::newArray(QPDFObjectHandle *this,QPDFMatrix *matrix)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long lVar2;
  QPDFObjectHandle QVar3;
  initializer_list<QPDFObjectHandle> __l;
  allocator_type local_99;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_98;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  
  newReal(&local_80,matrix->a,0,true);
  newReal(&local_70,matrix->b,0,true);
  newReal(&local_60,matrix->c,0,true);
  newReal(&local_50,matrix->d,0,true);
  newReal(&local_40,matrix->e,0,true);
  newReal(&local_30,matrix->f,0,true);
  __l._M_len = 6;
  __l._M_array = &local_80;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_98,__l,&local_99);
  newArray(this,&local_98);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_98);
  lVar2 = 0x60;
  _Var1._M_pi = extraout_RDX;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_98.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var1._M_pi = extraout_RDX_00;
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(QPDFMatrix const& matrix)
{
    return newArray(
        {newReal(matrix.a),
         newReal(matrix.b),
         newReal(matrix.c),
         newReal(matrix.d),
         newReal(matrix.e),
         newReal(matrix.f)});
}